

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O0

void __thiscall
vkt::compute::anon_unknown_0::InvertSSBOInPlaceTest::initPrograms
          (InvertSSBOInPlaceTest *this,SourceCollections *sourceCollections)

{
  int iVar1;
  ostream *poVar2;
  ProgramSources *this_00;
  string local_238;
  ShaderSource local_218;
  allocator<char> local_1e9;
  string local_1e8;
  byte local_1c2;
  allocator<char> local_1c1;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream src;
  SourceCollections *sourceCollections_local;
  InvertSSBOInPlaceTest *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar2 = std::operator<<((ostream *)local_190,"#version 310 es\n");
  poVar2 = std::operator<<(poVar2,"layout (local_size_x = ");
  iVar1 = tcu::Vector<int,_3>::x(&this->m_localSize);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,", local_size_y = ");
  iVar1 = tcu::Vector<int,_3>::y(&this->m_localSize);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,", local_size_z = ");
  iVar1 = tcu::Vector<int,_3>::z(&this->m_localSize);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,") in;\n");
  poVar2 = std::operator<<(poVar2,"layout(binding = 0) buffer InOut {\n");
  poVar2 = std::operator<<(poVar2,"    uint values[");
  local_1c2 = 0;
  if ((this->m_sized & 1U) == 0) {
    std::allocator<char>::allocator();
    local_1c2 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"",&local_1c1);
  }
  else {
    de::toString<unsigned_int>(&local_1c0,&this->m_numValues);
  }
  poVar2 = std::operator<<(poVar2,(string *)&local_1c0);
  poVar2 = std::operator<<(poVar2,"];\n");
  poVar2 = std::operator<<(poVar2,"} sb_inout;\n");
  poVar2 = std::operator<<(poVar2,"void main (void) {\n");
  poVar2 = std::operator<<(poVar2,
                           "    uvec3 size           = gl_NumWorkGroups * gl_WorkGroupSize;\n");
  poVar2 = std::operator<<(poVar2,
                           "    uint numValuesPerInv = uint(sb_inout.values.length()) / (size.x*size.y*size.z);\n"
                          );
  poVar2 = std::operator<<(poVar2,
                           "    uint groupNdx        = size.x*size.y*gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
                          );
  poVar2 = std::operator<<(poVar2,"    uint offset          = numValuesPerInv*groupNdx;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"    for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n");
  poVar2 = std::operator<<(poVar2,
                           "        sb_inout.values[offset + ndx] = ~sb_inout.values[offset + ndx];\n"
                          );
  std::operator<<(poVar2,"}\n");
  std::__cxx11::string::~string((string *)&local_1c0);
  if ((local_1c2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_1c1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"comp",&local_1e9);
  this_00 = ::vk::ProgramCollection<glu::ProgramSources>::add
                      (&sourceCollections->glslSources,&local_1e8);
  std::__cxx11::ostringstream::str();
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_218,&local_238);
  glu::ProgramSources::operator<<(this_00,&local_218);
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void InvertSSBOInPlaceTest::initPrograms (SourceCollections& sourceCollections) const
{
	std::ostringstream src;
	src << "#version 310 es\n"
		<< "layout (local_size_x = " << m_localSize.x() << ", local_size_y = " << m_localSize.y() << ", local_size_z = " << m_localSize.z() << ") in;\n"
		<< "layout(binding = 0) buffer InOut {\n"
		<< "    uint values[" << (m_sized ? de::toString(m_numValues) : "") << "];\n"
		<< "} sb_inout;\n"
		<< "void main (void) {\n"
		<< "    uvec3 size           = gl_NumWorkGroups * gl_WorkGroupSize;\n"
		<< "    uint numValuesPerInv = uint(sb_inout.values.length()) / (size.x*size.y*size.z);\n"
		<< "    uint groupNdx        = size.x*size.y*gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
		<< "    uint offset          = numValuesPerInv*groupNdx;\n"
		<< "\n"
		<< "    for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n"
		<< "        sb_inout.values[offset + ndx] = ~sb_inout.values[offset + ndx];\n"
		<< "}\n";

	sourceCollections.glslSources.add("comp") << glu::ComputeSource(src.str());
}